

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O3

bool __thiscall leveldb::log::Reader::ReadRecord(Reader *this,Slice *record,string *scratch)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  size_type sVar6;
  uint64_t uVar7;
  Slice fragment;
  char buf [40];
  Slice local_78;
  Slice *local_68;
  uint64_t local_60;
  char local_58 [40];
  
  if ((this->last_record_offset_ < this->initial_offset_) &&
     (bVar3 = SkipToInitialBlock(this), !bVar3)) {
    return false;
  }
  bVar3 = false;
  scratch->_M_string_length = 0;
  *(scratch->_M_dataplus)._M_p = '\0';
  record->data_ = "";
  record->size_ = 0;
  local_78.data_ = "";
  local_78.size_ = 0;
  local_60 = 0;
  local_68 = record;
LAB_0010f462:
  uVar4 = ReadPhysicalRecord(this,&local_78);
  sVar2 = local_78.size_;
  sVar1 = (this->buffer_).size_;
  if (this->resyncing_ == true) goto code_r0x0010f484;
  goto LAB_0010f49a;
code_r0x0010f484:
  if (uVar4 != 3) {
    if (uVar4 != 4) {
      this->resyncing_ = false;
LAB_0010f49a:
      if (uVar4 - 1 < 6) {
        uVar7 = (this->end_of_buffer_offset_ - (sVar1 + local_78.size_)) - 7;
        switch(uVar4) {
        case 1:
          if ((bVar3) && (scratch->_M_string_length != 0)) {
            ReportCorruption(this,scratch->_M_string_length,"partial record without end(1)");
          }
          scratch->_M_string_length = 0;
          *(scratch->_M_dataplus)._M_p = '\0';
          local_68->data_ = local_78.data_;
          local_68->size_ = local_78.size_;
          this->last_record_offset_ = uVar7;
          return true;
        case 2:
          pcVar5 = (char *)scratch->_M_string_length;
          if (bVar3) {
            if (pcVar5 == (char *)0x0) {
              pcVar5 = (char *)0x0;
            }
            else {
              ReportCorruption(this,(uint64_t)pcVar5,"partial record without end(2)");
              pcVar5 = (char *)scratch->_M_string_length;
            }
          }
          std::__cxx11::string::_M_replace((ulong)scratch,0,pcVar5,(ulong)local_78.data_);
          bVar3 = true;
          local_60 = uVar7;
          goto LAB_0010f462;
        case 3:
          if (bVar3) {
            std::__cxx11::string::append((char *)scratch,(ulong)local_78.data_);
          }
          else {
            ReportCorruption(this,local_78.size_,"missing start of fragmented record(1)");
          }
          goto LAB_0010f462;
        case 4:
          if (bVar3) {
            std::__cxx11::string::append((char *)scratch,(ulong)local_78.data_);
            sVar6 = scratch->_M_string_length;
            local_68->data_ = (scratch->_M_dataplus)._M_p;
            local_68->size_ = sVar6;
            this->last_record_offset_ = local_60;
            return true;
          }
          ReportCorruption(this,local_78.size_,"missing start of fragmented record(2)");
          goto LAB_0010f462;
        case 5:
          if (!bVar3) {
            return false;
          }
          scratch->_M_string_length = 0;
          *(scratch->_M_dataplus)._M_p = '\0';
          return false;
        }
        if (!bVar3) goto LAB_0010f462;
        sVar6 = scratch->_M_string_length;
        pcVar5 = "error in middle of record";
      }
      else {
        snprintf(local_58,0x28,"unknown record type %u",(ulong)uVar4);
        if (bVar3) {
          sVar6 = scratch->_M_string_length;
        }
        else {
          sVar6 = 0;
        }
        sVar6 = sVar6 + sVar2;
        pcVar5 = local_58;
      }
      ReportCorruption(this,sVar6,pcVar5);
      scratch->_M_string_length = 0;
      *(scratch->_M_dataplus)._M_p = '\0';
      bVar3 = false;
      goto LAB_0010f462;
    }
    this->resyncing_ = false;
  }
  goto LAB_0010f462;
}

Assistant:

bool Reader::ReadRecord(Slice *record, std::string *scratch) {
            if (last_record_offset_ < initial_offset_) {
                if (!SkipToInitialBlock()) {
                    return false;
                }
            }

            scratch->clear();
            record->clear();
            bool in_fragmented_record = false;
            // Record offset of the logical record that we're reading
            // 0 is a dummy value to make compilers happy
            uint64_t prospective_record_offset = 0;

            Slice fragment;
            while (true) {
                const unsigned int record_type = ReadPhysicalRecord(&fragment);

                // ReadPhysicalRecord may have only had an empty trailer remaining in its
                // internal buffer. Calculate the offset of the next physical record now
                // that it has returned, properly accounting for its header size.
                uint64_t physical_record_offset =
                        end_of_buffer_offset_ - buffer_.size() - kHeaderSize - fragment.size();

                if (resyncing_) {
                    if (record_type == kMiddleType) {
                        continue;
                    } else if (record_type == kLastType) {
                        resyncing_ = false;
                        continue;
                    } else {
                        resyncing_ = false;
                    }
                }

                switch (record_type) {
                    case kFullType:
                        if (in_fragmented_record) {
                            // Handle bug in earlier versions of log::Writer where
                            // it could emit an empty kFirstType record at the tail end
                            // of a block followed by a kFullType or kFirstType record
                            // at the beginning of the next block.
                            if (scratch->empty()) {
                                in_fragmented_record = false;
                            } else {
                                ReportCorruption(scratch->size(), "partial record without end(1)");
                            }
                        }
                        prospective_record_offset = physical_record_offset;
                        scratch->clear();
                        *record = fragment;
                        last_record_offset_ = prospective_record_offset;
                        return true;

                    case kFirstType:
                        if (in_fragmented_record) {
                            // Handle bug in earlier versions of log::Writer where
                            // it could emit an empty kFirstType record at the tail end
                            // of a block followed by a kFullType or kFirstType record
                            // at the beginning of the next block.
                            if (scratch->empty()) {
                                in_fragmented_record = false;
                            } else {
                                ReportCorruption(scratch->size(), "partial record without end(2)");
                            }
                        }
                        prospective_record_offset = physical_record_offset;
                        scratch->assign(fragment.data(), fragment.size());
                        in_fragmented_record = true;
                        break;

                    case kMiddleType:
                        if (!in_fragmented_record) {
                            ReportCorruption(fragment.size(),
                                             "missing start of fragmented record(1)");
                        } else {
                            scratch->append(fragment.data(), fragment.size());
                        }
                        break;

                    case kLastType:
                        if (!in_fragmented_record) {
                            ReportCorruption(fragment.size(),
                                             "missing start of fragmented record(2)");
                        } else {
                            scratch->append(fragment.data(), fragment.size());
                            *record = Slice(*scratch);
                            last_record_offset_ = prospective_record_offset;
                            return true;
                        }
                        break;

                    case kEof:
                        if (in_fragmented_record) {
                            // This can be caused by the writer dying immediately after
                            // writing a physical record but before completing the next; don't
                            // treat it as a corruption, just ignore the entire logical record.
                            scratch->clear();
                        }
                        return false;

                    case kBadRecord:
                        if (in_fragmented_record) {
                            ReportCorruption(scratch->size(), "error in middle of record");
                            in_fragmented_record = false;
                            scratch->clear();
                        }
                        break;

                    default: {
                        char buf[40];
                        snprintf(buf, sizeof(buf), "unknown record type %u", record_type);
                        ReportCorruption(
                                (fragment.size() + (in_fragmented_record ? scratch->size() : 0)),
                                buf);
                        in_fragmented_record = false;
                        scratch->clear();
                        break;
                    }
                }
            }
            return false;
        }